

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_die.cc
# Opt level: O1

const_iterator * __thiscall
pstack::Dwarf::DIE::Children::begin(const_iterator *__return_storage_ptr__,Children *this)

{
  DIE *parent;
  DIE local_48;
  
  parent = this->parent;
  Unit::offsetToDIE(&local_48,
                    (parent->unit).
                    super___shared_ptr<pstack::Dwarf::Unit,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                    parent,((parent->raw).
                            super___shared_ptr<pstack::Dwarf::DIE::Raw,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr)->firstChild);
  const_iterator::const_iterator(__return_storage_ptr__,&local_48,this->parent);
  ~DIE(&local_48);
  return __return_storage_ptr__;
}

Assistant:

DIE::Children::const_iterator
DIE::Children::begin() const {
    return const_iterator(parent.firstChild(), parent);
}